

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool re2::ParseEscape(StringPiece *s,Rune *rp,RegexpStatus *status,int rune_max)

{
  const_pointer str;
  RegexpStatus *pRVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  const_reference pcVar5;
  size_type sVar6;
  const_pointer pcVar7;
  StringPiece local_78;
  int local_68;
  RegexpStatusCode local_64;
  int nhex;
  int code;
  Rune c1;
  Rune c;
  StringPiece local_48;
  const_pointer local_38;
  char *begin;
  RegexpStatus *pRStack_28;
  int rune_max_local;
  RegexpStatus *status_local;
  Rune *rp_local;
  StringPiece *s_local;
  
  begin._4_4_ = rune_max;
  pRStack_28 = status;
  status_local = (RegexpStatus *)rp;
  rp_local = (Rune *)s;
  local_38 = StringPiece::data(s);
  bVar2 = StringPiece::empty((StringPiece *)rp_local);
  if ((bVar2) || (pcVar5 = StringPiece::operator[]((StringPiece *)rp_local,0), *pcVar5 != '\\')) {
    RegexpStatus::set_code(pRStack_28,kRegexpInternalError);
    pRVar1 = pRStack_28;
    StringPiece::StringPiece(&local_48);
    RegexpStatus::set_error_arg(pRVar1,&local_48);
    return false;
  }
  sVar6 = StringPiece::size((StringPiece *)rp_local);
  if (sVar6 == 1) {
    RegexpStatus::set_code(pRStack_28,kRegexpTrailingBackslash);
    pRVar1 = pRStack_28;
    StringPiece::StringPiece((StringPiece *)&c1);
    RegexpStatus::set_error_arg(pRVar1,(StringPiece *)&c1);
    return false;
  }
  StringPiece::remove_prefix((StringPiece *)rp_local,1);
  iVar3 = StringPieceToRune(&code,(StringPiece *)rp_local,pRStack_28);
  if (iVar3 < 0) {
    return false;
  }
  switch(code) {
  case 0x30:
switchD_0037c1d8_caseD_30:
    local_64 = code - 0x30;
    bVar2 = StringPiece::empty((StringPiece *)rp_local);
    if (!bVar2) {
      pcVar5 = StringPiece::operator[]((StringPiece *)rp_local,0);
      code = (int)*pcVar5;
      if ((0x2f < code) && (code < 0x38)) {
        local_64 = (local_64 * 8 + code) - 0x30;
        StringPiece::remove_prefix((StringPiece *)rp_local,1);
        bVar2 = StringPiece::empty((StringPiece *)rp_local);
        if (!bVar2) {
          pcVar5 = StringPiece::operator[]((StringPiece *)rp_local,0);
          code = (int)*pcVar5;
          if ((0x2f < code) && (code < 0x38)) {
            local_64 = (local_64 * 8 + code) - 0x30;
            StringPiece::remove_prefix((StringPiece *)rp_local,1);
          }
        }
      }
    }
    if ((int)local_64 <= begin._4_4_) {
      status_local->code_ = local_64;
      return true;
    }
    goto LAB_0037c50c;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
    bVar2 = StringPiece::empty((StringPiece *)rp_local);
    if (((!bVar2) && (pcVar5 = StringPiece::operator[]((StringPiece *)rp_local,0), '/' < *pcVar5))
       && (pcVar5 = StringPiece::operator[]((StringPiece *)rp_local,0), *pcVar5 < '8'))
    goto switchD_0037c1d8_caseD_30;
    goto LAB_0037c50c;
  default:
    if (((code < 0x80) && (iVar3 = isalpha(code), iVar3 == 0)) &&
       (iVar3 = isdigit(code), iVar3 == 0)) {
      status_local->code_ = code;
      return true;
    }
    goto LAB_0037c50c;
  case 0x61:
    status_local->code_ = kRegexpUnexpectedParen;
    s_local._7_1_ = true;
    break;
  case 0x66:
    status_local->code_ = kRegexpBadPerlOp;
    s_local._7_1_ = true;
    break;
  case 0x6e:
    status_local->code_ = kRegexpRepeatSize;
    s_local._7_1_ = true;
    break;
  case 0x72:
    status_local->code_ = kRegexpBadUTF8;
    s_local._7_1_ = true;
    break;
  case 0x74:
    status_local->code_ = kRegexpRepeatArgument;
    s_local._7_1_ = true;
    break;
  case 0x76:
    status_local->code_ = kRegexpRepeatOp;
    s_local._7_1_ = true;
    break;
  case 0x78:
    bVar2 = StringPiece::empty((StringPiece *)rp_local);
    if (!bVar2) {
      iVar3 = StringPieceToRune(&code,(StringPiece *)rp_local,pRStack_28);
      if (iVar3 < 0) {
        return false;
      }
      if (code == 0x7b) {
        iVar3 = StringPieceToRune(&code,(StringPiece *)rp_local,pRStack_28);
        if (iVar3 < 0) {
          return false;
        }
        local_68 = 0;
        local_64 = kRegexpSuccess;
        while (iVar3 = IsHex(code), iVar3 != 0) {
          local_68 = local_68 + 1;
          iVar3 = local_64 * 0x10;
          iVar4 = UnHex(code);
          local_64 = iVar3 + iVar4;
          if ((begin._4_4_ < (int)local_64) ||
             (bVar2 = StringPiece::empty((StringPiece *)rp_local), bVar2)) goto LAB_0037c50c;
          iVar3 = StringPieceToRune(&code,(StringPiece *)rp_local,pRStack_28);
          if (iVar3 < 0) {
            return false;
          }
        }
        if ((code == 0x7d) && (local_68 != 0)) {
          status_local->code_ = local_64;
          return true;
        }
      }
      else {
        bVar2 = StringPiece::empty((StringPiece *)rp_local);
        if (!bVar2) {
          iVar3 = StringPieceToRune(&nhex,(StringPiece *)rp_local,pRStack_28);
          if (iVar3 < 0) {
            return false;
          }
          iVar3 = IsHex(code);
          if ((iVar3 != 0) && (iVar3 = IsHex(nhex), iVar3 != 0)) {
            iVar3 = UnHex(code);
            iVar4 = UnHex(nhex);
            status_local->code_ = iVar3 * 0x10 + iVar4;
            return true;
          }
        }
      }
    }
LAB_0037c50c:
    RegexpStatus::set_code(pRStack_28,kRegexpBadEscape);
    pRVar1 = pRStack_28;
    str = local_38;
    pcVar7 = StringPiece::data((StringPiece *)rp_local);
    StringPiece::StringPiece(&local_78,str,(long)pcVar7 - (long)local_38);
    RegexpStatus::set_error_arg(pRVar1,&local_78);
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool ParseEscape(StringPiece* s, Rune* rp,
                        RegexpStatus* status, int rune_max) {
  const char* begin = s->data();
  if (s->empty() || (*s)[0] != '\\') {
    // Should not happen - caller always checks.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(StringPiece());
    return false;
  }
  if (s->size() == 1) {
    status->set_code(kRegexpTrailingBackslash);
    status->set_error_arg(StringPiece());
    return false;
  }
  Rune c, c1;
  s->remove_prefix(1);  // backslash
  if (StringPieceToRune(&c, s, status) < 0)
    return false;
  int code;
  switch (c) {
    default:
      if (c < Runeself && !isalpha(c) && !isdigit(c)) {
        // Escaped non-word characters are always themselves.
        // PCRE is not quite so rigorous: it accepts things like
        // \q, but we don't.  We once rejected \_, but too many
        // programs and people insist on using it, so allow \_.
        *rp = c;
        return true;
      }
      goto BadEscape;

    // Octal escapes.
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
      // Single non-zero octal digit is a backreference; not supported.
      if (s->empty() || (*s)[0] < '0' || (*s)[0] > '7')
        goto BadEscape;
      FALLTHROUGH_INTENDED;
    case '0':
      // consume up to three octal digits; already have one.
      code = c - '0';
      if (!s->empty() && '0' <= (c = (*s)[0]) && c <= '7') {
        code = code * 8 + c - '0';
        s->remove_prefix(1);  // digit
        if (!s->empty()) {
          c = (*s)[0];
          if ('0' <= c && c <= '7') {
            code = code * 8 + c - '0';
            s->remove_prefix(1);  // digit
          }
        }
      }
      if (code > rune_max)
        goto BadEscape;
      *rp = code;
      return true;

    // Hexadecimal escapes
    case 'x':
      if (s->empty())
        goto BadEscape;
      if (StringPieceToRune(&c, s, status) < 0)
        return false;
      if (c == '{') {
        // Any number of digits in braces.
        // Update n as we consume the string, so that
        // the whole thing gets shown in the error message.
        // Perl accepts any text at all; it ignores all text
        // after the first non-hex digit.  We require only hex digits,
        // and at least one.
        if (StringPieceToRune(&c, s, status) < 0)
          return false;
        int nhex = 0;
        code = 0;
        while (IsHex(c)) {
          nhex++;
          code = code * 16 + UnHex(c);
          if (code > rune_max)
            goto BadEscape;
          if (s->empty())
            goto BadEscape;
          if (StringPieceToRune(&c, s, status) < 0)
            return false;
        }
        if (c != '}' || nhex == 0)
          goto BadEscape;
        *rp = code;
        return true;
      }
      // Easy case: two hex digits.
      if (s->empty())
        goto BadEscape;
      if (StringPieceToRune(&c1, s, status) < 0)
        return false;
      if (!IsHex(c) || !IsHex(c1))
        goto BadEscape;
      *rp = UnHex(c) * 16 + UnHex(c1);
      return true;

    // C escapes.
    case 'n':
      *rp = '\n';
      return true;
    case 'r':
      *rp = '\r';
      return true;
    case 't':
      *rp = '\t';
      return true;

    // Less common C escapes.
    case 'a':
      *rp = '\a';
      return true;
    case 'f':
      *rp = '\f';
      return true;
    case 'v':
      *rp = '\v';
      return true;

    // This code is disabled to avoid misparsing
    // the Perl word-boundary \b as a backspace
    // when in POSIX regexp mode.  Surprisingly,
    // in Perl, \b means word-boundary but [\b]
    // means backspace.  We don't support that:
    // if you want a backspace embed a literal
    // backspace character or use \x08.
    //
    // case 'b':
    //   *rp = '\b';
    //   return true;
  }

BadEscape:
  // Unrecognized escape sequence.
  status->set_code(kRegexpBadEscape);
  status->set_error_arg(
      StringPiece(begin, static_cast<size_t>(s->data() - begin)));
  return false;
}